

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.hpp
# Opt level: O0

nanoseconds binlog::clockSinceEpoch(void)

{
  type tVar1;
  timespec ts;
  duration<long,std::ratio<1l,1000000000l>> local_30 [8];
  duration<long,std::ratio<1l,1l>> local_28 [8];
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffe0;
  duration<long,_std::ratio<1L,_1L>_> *in_stack_ffffffffffffffe8;
  long alStack_10 [2];
  
  memset(&stack0xffffffffffffffe8,0,0x10);
  clock_gettime(0,(timespec *)&stack0xffffffffffffffe8);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            (local_28,(long *)&stack0xffffffffffffffe8);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,void>(local_30,alStack_10);
  tVar1 = std::chrono::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  return (nanoseconds)tVar1.__r;
}

Assistant:

clockSinceEpoch()
{
  // Depending on how libstdc++ is built (_GLIBCXX_USE_CLOCK_GETTIME_SYSCALL),
  // system_clock::now() can result in a clock_gettime syscall,
  // which is really slow compared to the vsyscall equivalent.
  // Call clock_gettime unconditionally on linux:
  #ifdef __linux__
    struct timespec ts{};
    clock_gettime(CLOCK_REALTIME, &ts);
    return std::chrono::nanoseconds{
      std::chrono::seconds{ts.tv_sec} + std::chrono::nanoseconds{ts.tv_nsec}
    };
  #else
    return std::chrono::system_clock::now().time_since_epoch();
  #endif
}